

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O1

void __thiscall bandit::reporter::xunit::print_remaining_header_with_time(xunit *this)

{
  long lVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar1 = lVar1 - (this->testcase_start_time_point_).__d.__r;
  (this->testsuite_runtime_).__r = (this->testsuite_runtime_).__r + lVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x80," time=\"",7);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_30,vsnprintf,0x148,"%f",(double)lVar1 / 1000000000.0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x80,local_30._M_dataplus._M_p,
                      local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\">\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void print_remaining_header_with_time() {
        auto dur = std::chrono::high_resolution_clock::now() - testcase_start_time_point_;
        testsuite_runtime_ += std::chrono::duration_cast<std::chrono::nanoseconds>(dur);
        std::chrono::duration<double> dur_in_sec(dur);
        work_stm_ << " time=\"" << std::to_string(dur_in_sec.count()) << "\">\n";
      }